

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::SubroutineSymbol::connectExternInterfacePrototype(SubroutineSymbol *this)

{
  string_view *psVar1;
  SymbolKind SVar2;
  Scope *this_00;
  MethodPrototypeSymbol *this_01;
  ExternImpl *pEVar3;
  bool bVar4;
  InstanceSymbol *this_02;
  Symbol *pSVar5;
  Diagnostic *pDVar6;
  Diagnostic *this_03;
  ExternImpl *pEVar7;
  SourceLocation location;
  char *pcVar8;
  DiagCode code;
  DiagCode code_00;
  string_view name;
  SourceRange SVar9;
  IfaceConn IVar10;
  string_view arg;
  Token nameToken;
  ModportSymbol *local_50;
  Token local_48;
  string_view *local_38;
  
  if (this->prototype != (MethodPrototypeSymbol *)0x0) {
    return;
  }
  this_00 = (this->super_Symbol).parentScope;
  local_48 = slang::syntax::SyntaxNode::getFirstToken
                       (*(SyntaxNode **)((this->super_Symbol).originatingSyntax[3].parent + 5));
  name = parsing::Token::valueText(&local_48);
  this_02 = (InstanceSymbol *)Scope::find(this_00,name);
  if (this_02 == (InstanceSymbol *)0x0) {
    if (name._M_len == 0) {
      return;
    }
    SVar9 = parsing::Token::range(&local_48);
    code.subsystem = Lookup;
    code.code = 0x34;
  }
  else {
    SVar2 = (this_02->super_InstanceSymbolBase).super_Symbol.kind;
    if ((int)SVar2 < 0x31) {
      if (SVar2 == InterfacePort) {
        IVar10 = InterfacePortSymbol::getConnection((InterfacePortSymbol *)this_02);
        if (IVar10.first == (Symbol *)0x0) {
          return;
        }
        if ((IVar10.first)->kind == InstanceArray) goto LAB_0030d07f;
      }
      else {
        if ((SVar2 != Instance) || (bVar4 = InstanceSymbol::isInterface(this_02), !bVar4))
        goto LAB_0030d036;
        IVar10.second = (ModportSymbol *)0x0;
        IVar10.first = (Symbol *)this_02;
      }
      local_50 = IVar10.second;
      psVar1 = &(this->super_Symbol).name;
      pSVar5 = Scope::find((Scope *)(IVar10.first[1].name._M_str + 0x40),(this->super_Symbol).name);
      if (pSVar5 != (Symbol *)0x0) {
        local_38 = psVar1;
        if (pSVar5->kind == Subroutine) {
          if ((pSVar5[3].field_0x4 & 0x10) != 0) {
            this_01 = (MethodPrototypeSymbol *)pSVar5[4].name._M_str;
            if ((((this_01->flags).m_bits & 0x800) == 0) &&
               (this_01->firstExternImpl != (ExternImpl *)0x0)) {
              pDVar6 = Scope::addDiag(this_00,(DiagCode)0x300006,(this->super_Symbol).location);
              bVar4 = this->subroutineKind == Function;
              pcVar8 = "task";
              if (bVar4) {
                pcVar8 = "function";
              }
              arg._M_str = pcVar8;
              arg._M_len = (ulong)bVar4 * 4 + 4;
              Diagnostic::operator<<(pDVar6,arg);
              this_03 = Diagnostic::operator<<(pDVar6,name);
              Diagnostic::operator<<(this_03,(this->super_Symbol).name);
              Diagnostic::addNote(pDVar6,(DiagCode)0xa0001,
                                  (((this_01->firstExternImpl->impl).ptr)->super_Symbol).location);
            }
            pEVar7 = BumpAllocator::
                     emplace<slang::ast::MethodPrototypeSymbol::ExternImpl,slang::ast::SubroutineSymbol_const&>
                               (&((this_01->super_Scope).compilation)->super_BumpAllocator,this);
            pEVar3 = this_01->firstExternImpl;
            this_01->firstExternImpl = pEVar7;
            pEVar7->next = pEVar3;
            MethodPrototypeSymbol::checkMethodMatch(this_01,this_00,this);
            this->prototype = this_01;
            if (local_50 == (ModportSymbol *)0x0) {
              return;
            }
            if (local_50->hasExports != true) {
              return;
            }
            connectExternInterfacePrototype();
            return;
          }
          location = (this->super_Symbol).location;
          code_00.subsystem = Declarations;
          code_00.code = 0x42;
        }
        else {
          location = (this->super_Symbol).location;
          code_00.subsystem = Lookup;
          code_00.code = 0x23;
        }
        pDVar6 = Scope::addDiag(this_00,code_00,location);
        Diagnostic::operator<<(pDVar6,(this->super_Symbol).name);
        Diagnostic::addNote(pDVar6,(DiagCode)0x50001,pSVar5->location);
        return;
      }
      if (psVar1->_M_len == 0) {
        return;
      }
      pDVar6 = Scope::addDiag(this_00,(DiagCode)0x3a000a,(this->super_Symbol).location);
      pDVar6 = Diagnostic::operator<<(pDVar6,(this->super_Symbol).name);
      goto LAB_0030d053;
    }
    if (SVar2 == InstanceArray) {
LAB_0030d07f:
      SVar9 = parsing::Token::range(&local_48);
      Scope::addDiag(this_00,(DiagCode)0x3b0006,SVar9);
      return;
    }
    if (SVar2 == UninstantiatedDef) {
      return;
    }
LAB_0030d036:
    SVar9 = parsing::Token::range(&local_48);
    code.subsystem = Lookup;
    code.code = 0x27;
  }
  pDVar6 = Scope::addDiag(this_00,code,SVar9);
LAB_0030d053:
  Diagnostic::operator<<(pDVar6,name);
  return;
}

Assistant:

void SubroutineSymbol::connectExternInterfacePrototype() const {
    if (prototype)
        return;

    auto scope = getParentScope();
    auto syntax = getSyntax();
    SLANG_ASSERT(scope && syntax);

    auto nameToken = syntax->as<FunctionDeclarationSyntax>().prototype->name->getFirstToken();
    auto ifaceName = nameToken.valueText();
    auto symbol = scope->find(ifaceName);
    if (!symbol) {
        if (!ifaceName.empty())
            scope->addDiag(diag::UndeclaredIdentifier, nameToken.range()) << ifaceName;
        return;
    }

    const InstanceSymbol* inst = nullptr;
    const ModportSymbol* modport = nullptr;
    if (symbol->kind == SymbolKind::InterfacePort) {
        const Symbol* conn;
        auto& port = symbol->as<InterfacePortSymbol>();
        std::tie(conn, modport) = port.getConnection();
        if (!conn)
            return;

        if (conn->kind == SymbolKind::InstanceArray) {
            scope->addDiag(diag::ExternIfaceArrayMethod, nameToken.range());
            return;
        }

        inst = &conn->as<InstanceSymbol>();
    }
    else if (symbol->kind == SymbolKind::Instance) {
        inst = &symbol->as<InstanceSymbol>();
        if (!inst->isInterface()) {
            scope->addDiag(diag::NotAnInterfaceOrPort, nameToken.range()) << ifaceName;
            return;
        }
    }
    else if (symbol->kind == SymbolKind::InstanceArray) {
        scope->addDiag(diag::ExternIfaceArrayMethod, nameToken.range());
        return;
    }
    else {
        if (symbol->kind != SymbolKind::UninstantiatedDef)
            scope->addDiag(diag::NotAnInterfaceOrPort, nameToken.range()) << ifaceName;
        return;
    }

    auto ifaceMethod = inst->body.find(name);
    if (!ifaceMethod) {
        if (!name.empty())
            scope->addDiag(diag::UnknownMember, location) << name << ifaceName;
        return;
    }

    if (ifaceMethod->kind != SymbolKind::Subroutine) {
        auto& diag = scope->addDiag(diag::NotASubroutine, location);
        diag << name;
        diag.addNote(diag::NoteDeclarationHere, ifaceMethod->location);
        return;
    }

    auto& sub = ifaceMethod->as<SubroutineSymbol>();
    if (!sub.flags.has(MethodFlags::InterfaceExtern)) {
        auto& diag = scope->addDiag(diag::IfaceMethodNotExtern, location);
        diag << name;
        diag.addNote(diag::NoteDeclarationHere, ifaceMethod->location);
        return;
    }

    auto proto = sub.getPrototype();
    SLANG_ASSERT(proto);

    if (!proto->flags.has(MethodFlags::ForkJoin) && proto->getFirstExternImpl() != nullptr) {
        auto& diag = scope->addDiag(diag::DupInterfaceExternMethod, location);
        diag << (subroutineKind == SubroutineKind::Function ? "function"sv : "task"sv);
        diag << ifaceName << name;
        diag.addNote(diag::NotePreviousDefinition, proto->getFirstExternImpl()->impl->location);
    }

    proto->addExternImpl(*this);
    proto->checkMethodMatch(*scope, *this);
    prototype = proto;

    // If our connection goes through a modport that exports us we should register ourselves
    // as an implementation for that export to facilitate checking for missing exports later.
    if (modport && modport->hasExports) {
        if (auto it = modport->getNameMap().find(name); it != modport->getNameMap().end()) {
            if (it->second && it->second->kind == SymbolKind::MethodPrototype) {
                auto& modportProto = it->second->as<MethodPrototypeSymbol>();
                if (modportProto.flags.has(MethodFlags::ModportExport))
                    modportProto.addExternImpl(*this);
            }
        }
    }
}